

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O0

Literal_t *
Rpo_Recursion(uint *target,Literal_t **vecLit,int nLit,int nLitCount,int nVars,int *thresholdCount,
             int thresholdMax,int verbose)

{
  Literal_t *lit2;
  int iVar1;
  int iVar2;
  Literal_t *pLVar3;
  int *vertexDegree_00;
  Rpo_LCI_Edge_t **edges_00;
  Rpo_LCI_Edge_t *pRVar4;
  Literal_t *lit;
  uint local_b8;
  uint local_b4;
  Literal_t *newLit;
  Literal_t *oldLit2;
  Literal_t *oldLit1;
  int maxLitIndex;
  int minLitIndex;
  int edgeIndex;
  Literal_t *result;
  Rpo_LCI_Edge_t *edge;
  int isOr;
  int isAnd;
  int edgeCount;
  Rpo_LCI_Edge_t **edges;
  int edgeSize;
  int v;
  int *vertexDegree;
  Literal_t *copyResult;
  int local_40;
  int k;
  int j;
  int i;
  int *thresholdCount_local;
  int nVars_local;
  int nLitCount_local;
  int nLit_local;
  Literal_t **vecLit_local;
  uint *target_local;
  
  isOr = 0;
  _minLitIndex = (Literal_t *)0x0;
  *thresholdCount = *thresholdCount + 1;
  if (*thresholdCount == thresholdMax) {
    target_local = (uint *)0x0;
  }
  else {
    if (verbose != 0) {
      Abc_Print(-2,"Entering recursion %d\n",(ulong)(uint)*thresholdCount);
    }
    if (nLitCount == 1) {
      if (verbose != 0) {
        Abc_Print(-2,"Checking solution: ");
      }
      for (copyResult._4_4_ = 0; copyResult._4_4_ < nLit; copyResult._4_4_ = copyResult._4_4_ + 1) {
        if ((vecLit[copyResult._4_4_] != (Literal_t *)0x0) &&
           (iVar1 = Kit_TruthIsEqual(target,vecLit[copyResult._4_4_]->function,nVars), iVar1 != 0))
        {
          pLVar3 = Lit_Copy(vecLit[copyResult._4_4_],nVars);
          if (verbose == 0) {
            return pLVar3;
          }
          Abc_Print(-2,"FOUND!\n",thresholdCount);
          return pLVar3;
        }
      }
      if (verbose != 0) {
        Abc_Print(-2,"FAILED!\n",thresholdCount);
      }
      target_local = (uint *)0x0;
    }
    else {
      vertexDegree_00 = (int *)malloc((long)nLit << 2);
      for (edges._4_4_ = 0; edges._4_4_ < nLit; edges._4_4_ = edges._4_4_ + 1) {
        vertexDegree_00[edges._4_4_] = 0;
      }
      edges_00 = (Rpo_LCI_Edge_t **)malloc((long)((nLit * (nLit + -1)) / 2) << 3);
      if (verbose != 0) {
        Abc_Print(-2,"Creating Edges: \n");
      }
      for (k = 0; k < nLit; k = k + 1) {
        if (vecLit[k] != (Literal_t *)0x0) {
          for (local_40 = k; local_40 < nLit; local_40 = local_40 + 1) {
            if (vecLit[local_40] != (Literal_t *)0x0) {
              iVar1 = Rpo_CheckANDGroup(vecLit[k],vecLit[local_40],nVars);
              iVar2 = Rpo_CheckORGroup(vecLit[k],vecLit[local_40],nVars);
              if (iVar1 != 0) {
                if (verbose != 0) {
                  Abc_Print(-2,"Grouped: ");
                  Lit_PrintExp(vecLit[local_40]);
                  Abc_Print(-2," AND ");
                  Lit_PrintExp(vecLit[k]);
                  Abc_Print(-2,"\n");
                }
                pRVar4 = Rpo_CreateEdge(LIT_AND,k,local_40,vertexDegree_00);
                edges_00[isOr] = pRVar4;
                isOr = isOr + 1;
              }
              if (iVar2 != 0) {
                if (verbose != 0) {
                  Abc_Print(-2,"Grouped: ");
                  Lit_PrintExp(vecLit[local_40]);
                  Abc_Print(-2," OR ");
                  Lit_PrintExp(vecLit[k]);
                  Abc_Print(-2,"\n");
                }
                pRVar4 = Rpo_CreateEdge(LIT_OR,k,local_40,vertexDegree_00);
                edges_00[isOr] = pRVar4;
                isOr = isOr + 1;
              }
            }
          }
        }
      }
      if (verbose != 0) {
        Abc_Print(-2,"%d edges created.\n",(ulong)(uint)isOr);
      }
      while (iVar1 = Rpo_computeMinEdgeCost(edges_00,isOr,vertexDegree_00), -1 < iVar1) {
        pRVar4 = edges_00[iVar1];
        *pRVar4 = (Rpo_LCI_Edge_t)((ulong)*pRVar4 & 0xfffffffffffffffe | 1);
        if (((uint)((ulong)*pRVar4 >> 4) & 0x3fffffff) < SUB84(*pRVar4,4) >> 2) {
          local_b4 = (uint)((ulong)*pRVar4 >> 4) & 0x3fffffff;
        }
        else {
          local_b4 = SUB84(*pRVar4,4) >> 2;
        }
        if (SUB84(*pRVar4,4) >> 2 < ((uint)((ulong)*pRVar4 >> 4) & 0x3fffffff)) {
          local_b8 = (uint)((ulong)*pRVar4 >> 4) & 0x3fffffff;
        }
        else {
          local_b8 = SUB84(*pRVar4,4) >> 2;
        }
        pLVar3 = vecLit[(int)local_b4];
        lit2 = vecLit[(int)local_b8];
        lit = Lit_GroupLiterals(pLVar3,lit2,(Operator_t)((ulong)*pRVar4 >> 1) & LIT_XOR,nVars);
        vecLit[(int)local_b4] = lit;
        vecLit[(int)local_b8] = (Literal_t *)0x0;
        if (verbose != 0) {
          Abc_Print(-2,"New Literal Cluster found: ");
          Lit_PrintExp(lit);
          Abc_Print(-2," -> ");
          Lit_PrintTT(lit->function,nVars);
          Abc_Print(-2,"\n");
        }
        _minLitIndex = Rpo_Recursion(target,vecLit,nLit,nLitCount + -1,nVars,thresholdCount,
                                     thresholdMax,verbose);
        Lit_Free(lit);
        vecLit[(int)local_b4] = pLVar3;
        vecLit[(int)local_b8] = lit2;
        if ((*thresholdCount == thresholdMax) || (_minLitIndex != (Literal_t *)0x0))
        goto LAB_0070dbdf;
      }
      if (verbose != 0) {
        Abc_Print(-2,"There is no edges unvisited... Exiting recursion.\n");
      }
LAB_0070dbdf:
      if (vertexDegree_00 != (int *)0x0) {
        free(vertexDegree_00);
      }
      for (k = 0; k < isOr; k = k + 1) {
        if (edges_00[k] != (Rpo_LCI_Edge_t *)0x0) {
          free(edges_00[k]);
          edges_00[k] = (Rpo_LCI_Edge_t *)0x0;
        }
      }
      if (edges_00 != (Rpo_LCI_Edge_t **)0x0) {
        free(edges_00);
      }
      target_local = (uint *)_minLitIndex;
    }
  }
  return (Literal_t *)target_local;
}

Assistant:

Literal_t* Rpo_Recursion(unsigned* target, Literal_t** vecLit, int nLit, int nLitCount, int nVars, int* thresholdCount, int thresholdMax, int verbose) {
    int i, j, k;
    Literal_t* copyResult;
    int* vertexDegree;
    int v;
    int edgeSize;
    Rpo_LCI_Edge_t** edges;
    int edgeCount = 0;
    int isAnd;
    int isOr;
    Rpo_LCI_Edge_t* edge;
    Literal_t* result = NULL;
    int edgeIndex;
    int minLitIndex;
    int maxLitIndex;
    Literal_t* oldLit1;
    Literal_t* oldLit2;
    Literal_t* newLit;

    *thresholdCount = *thresholdCount + 1;
    if (*thresholdCount == thresholdMax) {
        return NULL;
    }
    if (verbose) {
        Abc_Print(-2, "Entering recursion %d\n", *thresholdCount);
    }
    // verify if solution is the target or not
    if (nLitCount == 1) {
        if (verbose) {
            Abc_Print(-2, "Checking solution: ");
        }
        for (k = 0; k < nLit; ++k) {
            if (vecLit[k] != NULL) {
                if (Kit_TruthIsEqual(target, vecLit[k]->function, nVars)) {
                    copyResult = Lit_Copy(vecLit[k], nVars);
                    if (verbose) {
                        Abc_Print(-2, "FOUND!\n", thresholdCount);
                    }
                    thresholdCount = 0; //??
                    return copyResult;
                }
            }
        }
        if (verbose) {
            Abc_Print(-2, "FAILED!\n", thresholdCount);
        }
        return NULL;
    }

    vertexDegree = ABC_ALLOC(int, nLit);
    //    if(verbose) {
    //        Abc_Print(-2,"Allocating vertexDegree...\n");
    //    }
    for (v = 0; v < nLit; v++) {
        vertexDegree[v] = 0;
    }
    // building edges
    edgeSize = (nLit * (nLit - 1)) / 2;
    edges = ABC_ALLOC(Rpo_LCI_Edge_t*, edgeSize);
    if (verbose) {
        Abc_Print(-2, "Creating Edges: \n");
    }

    for (i = 0; i < nLit; ++i) {
        if (vecLit[i] == NULL) {
            continue;
        }
        for (j = i; j < nLit; ++j) {
            if (vecLit[j] == NULL) {
                continue;
            }
            isAnd = Rpo_CheckANDGroup(vecLit[i], vecLit[j], nVars);
            isOr = Rpo_CheckORGroup(vecLit[i], vecLit[j], nVars);
            if (isAnd) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " AND ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_AND, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
            if (isOr) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " OR ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_OR, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
        }
    }
    if (verbose) {
        Abc_Print(-2, "%d edges created.\n", edgeCount);
    }


    //traverse the edges, grouping new Literal Clusters
    do {
        edgeIndex = Rpo_computeMinEdgeCost(edges, edgeCount, vertexDegree);
        if (edgeIndex < 0) {
            if (verbose) {
                Abc_Print(-2, "There is no edges unvisited... Exiting recursion.\n");
                //exit(-1);
            }
            break;
            //return NULL; // the graph does not have unvisited edges
        }
        edge = edges[edgeIndex];
        edge->visited = 1;
        //Rpo_PrintEdge(edge);
        minLitIndex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
        maxLitIndex = (edge->idx1 > edge->idx2) ? edge->idx1 : edge->idx2;
        oldLit1 = vecLit[minLitIndex];
        oldLit2 = vecLit[maxLitIndex];
        newLit = Lit_GroupLiterals(oldLit1, oldLit2, (Operator_t)edge->connectionType, nVars);
        vecLit[minLitIndex] = newLit;
        vecLit[maxLitIndex] = NULL;

        if (verbose) {
            Abc_Print(-2, "New Literal Cluster found: ");
            Lit_PrintExp(newLit);
            Abc_Print(-2, " -> ");
            Lit_PrintTT(newLit->function, nVars);
            Abc_Print(-2, "\n");
        }
        result = Rpo_Recursion(target, vecLit, nLit, (nLitCount - 1), nVars, thresholdCount, thresholdMax, verbose);
        //independent of result, free the newLit and restore the vector of Literal Clusters
        Lit_Free(newLit);
        vecLit[minLitIndex] = oldLit1;
        vecLit[maxLitIndex] = oldLit2;
        if (*thresholdCount == thresholdMax) {
            break;
        }
    } while (result == NULL);
    //freeing memory
    //    if(verbose) {
    //        Abc_Print(-2,"Freeing vertexDegree...\n");
    //    }
    ABC_FREE(vertexDegree);
    for (i = 0; i < edgeCount; ++i) {
        //Abc_Print(-2, "%p ", edges[i]);
        ABC_FREE(edges[i]);
    }
    ABC_FREE(edges);
    return result;
}